

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O2

void __thiscall CS248::StaticScene::Triangle::draw(Triangle *this,Color *c)

{
  size_t sVar1;
  Vector3D *pVVar2;
  
  glColor4f(c->r,c->g,c->b,c->a);
  glBegin(4);
  sVar1 = this->v1;
  pVVar2 = this->mesh->positions;
  glVertex3d(pVVar2[sVar1].x,pVVar2[sVar1].y,pVVar2[sVar1].z);
  sVar1 = this->v2;
  pVVar2 = this->mesh->positions;
  glVertex3d(pVVar2[sVar1].x,pVVar2[sVar1].y,pVVar2[sVar1].z);
  sVar1 = this->v3;
  pVVar2 = this->mesh->positions;
  glVertex3d(pVVar2[sVar1].x,pVVar2[sVar1].y,pVVar2[sVar1].z);
  glEnd();
  return;
}

Assistant:

void Triangle::draw(const Color& c) const {
  glColor4f(c.r, c.g, c.b, c.a);
  glBegin(GL_TRIANGLES);
  glVertex3d(mesh->positions[v1].x, mesh->positions[v1].y,
             mesh->positions[v1].z);
  glVertex3d(mesh->positions[v2].x, mesh->positions[v2].y,
             mesh->positions[v2].z);
  glVertex3d(mesh->positions[v3].x, mesh->positions[v3].y,
             mesh->positions[v3].z);
  glEnd();
}